

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string *
pugi::impl::anon_unknown_0::xpath_string::from_heap
          (char_t *begin,char_t *end,xpath_allocator *alloc)

{
  char_t *buffer;
  long in_RDX;
  long in_RSI;
  xpath_string *in_RDI;
  char_t *data;
  size_t length;
  xpath_string *pxVar1;
  char_t *in_stack_ffffffffffffffd8;
  
  if (in_RSI == in_RDX) {
    xpath_string(in_RDI);
    pxVar1 = in_RDI;
  }
  else {
    pxVar1 = in_RDI;
    buffer = duplicate_string(in_stack_ffffffffffffffd8,(size_t)in_RDI,(xpath_allocator *)in_RDI);
    if (buffer == (char_t *)0x0) {
      xpath_string(in_RDI);
    }
    else {
      xpath_string(in_RDI,buffer,true,in_RDX - in_RSI);
    }
  }
  return pxVar1;
}

Assistant:

static xpath_string from_heap(const char_t* begin, const char_t* end, xpath_allocator* alloc)
		{
			assert(begin <= end);

			if (begin == end)
				return xpath_string();

			size_t length = static_cast<size_t>(end - begin);
			const char_t* data = duplicate_string(begin, length, alloc);

			return data ? xpath_string(data, true, length) : xpath_string();
		}